

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_feedback(REF_GRID ref_grid,char *filename)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  FILE *__stream;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_INT n;
  FILE *file;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  uint local_a0;
  REF_INT nfilter;
  REF_INT nshort;
  REF_INT nsliver;
  REF_DBL location [3];
  double local_78;
  REF_DBL curve;
  REF_DBL diag;
  REF_DBL short_edge;
  REF_DBL short_edge_tol;
  REF_DBL angle;
  REF_DBL angle_tol;
  REF_INT faceid;
  REF_INT edgeid;
  REF_INT node;
  REF_INT geom;
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  REF_GEOM ref_geom;
  char *filename_local;
  REF_GRID ref_grid_local;
  
  ref_node = (REF_NODE)ref_grid->geom;
  ref_mpi = (REF_MPI)ref_grid->node;
  _node = ref_grid->mpi;
  angle = 10.0;
  short_edge = 0.001;
  ref_geom = (REF_GEOM)filename;
  filename_local = (char *)ref_grid;
  if (((REF_GEOM)ref_node)->effective == 0) {
    if ((ulong)ref_grid->partitioner == 1) {
      if (_node->id == 0) {
        printf("Triaging geometry for issues impacting efficiency and robustness\n");
      }
      if (_node->id == 0) {
        printf("scanning for discrete face corners with slivers or cusps of %.1f deg or less\n",
               angle);
        printf("slivers in flat regions constrain the mesh and are efficiency concerns\n");
        printf("cusps (very small angles) in curved regions may be fatal with loose tolerances\n");
        printf("  because the edge/face topology becomes ambiguous with adaptive refinement\n");
      }
      nfilter = 0;
      for (edgeid = 0; edgeid < ref_node->max; edgeid = edgeid + 1) {
        if (*(int *)((long)ref_node->global + (long)(edgeid * 6) * 4) == 0) {
          faceid = *(REF_INT *)((long)ref_node->global + (long)(edgeid * 6 + 5) * 4);
          uVar3 = ref_geom_node_min_angle((REF_GRID)filename_local,faceid,&short_edge_tol);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xaee,"ref_geom_feedback",(ulong)uVar3,"node angle");
            return uVar3;
          }
          if (short_edge_tol <= angle) {
            printf("%f %f %f # sliver deg=%.3f at geom node %d\n",
                   *(undefined8 *)(*(long *)(ref_mpi + 1) + (long)(faceid * 0xf) * 8),
                   *(undefined8 *)(*(long *)(ref_mpi + 1) + (long)(faceid * 0xf + 1) * 8),
                   *(undefined8 *)(*(long *)(ref_mpi + 1) + (long)(faceid * 0xf + 2) * 8),
                   short_edge_tol,
                   (ulong)*(uint *)((long)ref_node->global + (long)(edgeid * 6 + 1) * 4));
            nfilter = nfilter + 1;
          }
        }
      }
      if (_node->id == 0) {
        printf("%d geometry nodes with slivers or cusps of %.1f deg or less\n",angle,
               (ulong)(uint)nfilter);
      }
      local_a0 = 0;
      lVar1._0_4_ = ref_node->tet_quality;
      lVar1._4_4_ = ref_node->tri_quality;
      if (lVar1 != 0) {
        if (_node->id == 0) {
          printf("scanning for geom nodes with shortest/longest edge ratios of %.3f or less\n",
                 short_edge);
          printf("short edges are efficiency concerns that rarely create failures.\n");
        }
        for (edgeid = 0; edgeid < ref_node->max; edgeid = edgeid + 1) {
          if (*(int *)((long)ref_node->global + (long)(edgeid * 6) * 4) == 0) {
            faceid = *(REF_INT *)((long)ref_node->global + (long)(edgeid * 6 + 5) * 4);
            uVar3 = ref_geom_node_short_edge
                              ((REF_GRID)filename_local,faceid,&diag,&curve,
                               (REF_INT *)((long)&angle_tol + 4));
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xb09,"ref_geom_feedback",(ulong)uVar3,"short edge");
              return uVar3;
            }
            if (diag <= short_edge) {
              printf("%f %f %f # short edge %.2e ratio %.2e id %d\n",
                     *(undefined8 *)(*(long *)(ref_mpi + 1) + (long)(faceid * 0xf) * 8),
                     *(undefined8 *)(*(long *)(ref_mpi + 1) + (long)(faceid * 0xf + 1) * 8),
                     *(undefined8 *)(*(long *)(ref_mpi + 1) + (long)(faceid * 0xf + 2) * 8),curve,
                     diag,(ulong)angle_tol._4_4_);
              local_a0 = local_a0 + 1;
            }
          }
        }
        if (_node->id == 0) {
          printf("%d geometry nodes with shortest/longest edge ratios of %.3f or less\n",short_edge,
                 (ulong)local_a0);
        }
      }
      ref_private_status_reis_ai._4_4_ = 0;
      lVar2._0_4_ = ref_node->tet_quality;
      lVar2._4_4_ = ref_node->tri_quality;
      if (lVar2 != 0) {
        if (_node->id == 0) {
          printf("scanning for surface curvature tighter than face-edge tolerance\n");
          printf("tight surface curvature is ignored where it reduces mesh\n");
          printf("  spacing below edge and face parameter curve tolerance\n");
          printf("these locations are likely to be accommodated unless\n");
          printf("  the error estimation resolves the high surface curvature\n");
        }
        for (angle_tol._0_4_ = 1;
            (int)angle_tol._0_4_ <= *(int *)((long)&ref_node->old_n_global + 4);
            angle_tol._0_4_ = angle_tol._0_4_ + 1) {
          uVar3 = ref_geom_face_curve_tol
                            ((REF_GRID)filename_local,angle_tol._0_4_,&local_78,(REF_DBL *)&nshort);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xb24,"ref_geom_feedback",(ulong)uVar3,"curved face");
            return uVar3;
          }
          if (local_78 < 1.0) {
            printf("%f %f %f # curve/tol %.3e face id %d\n",_nshort,location[0],location[1],local_78
                   ,(ulong)angle_tol._0_4_);
            ref_private_status_reis_ai._4_4_ = ref_private_status_reis_ai._4_4_ + 1;
          }
        }
        if (_node->id == 0) {
          printf("%d locations with filtered curvature\n",(ulong)ref_private_status_reis_ai._4_4_);
        }
      }
      if ((_node->id == 0) &&
         (((0 < nfilter || (0 < (int)local_a0)) || (0 < (int)ref_private_status_reis_ai._4_4_)))) {
        __stream = fopen((char *)ref_geom,"w");
        if (__stream == (FILE *)0x0) {
          printf("unable to open %s\n",ref_geom);
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xb34,"ref_geom_feedback","unable to open file");
          return 2;
        }
        fprintf(__stream,"title=\"tecplot refine geometry triage\"\n");
        fprintf(__stream,"variables = \"x\" \"y\" \"z\"\n");
        if (0 < nfilter) {
          printf("exporting slivers locations to %s\n",ref_geom);
          fprintf(__stream,"zone t=\"sliver\", i=%d, datapacking=%s\n",(ulong)(uint)nfilter,"point")
          ;
          ref_private_status_reis_ai_1._4_4_ = 0;
          for (edgeid = 0; edgeid < ref_node->max; edgeid = edgeid + 1) {
            if (*(int *)((long)ref_node->global + (long)(edgeid * 6) * 4) == 0) {
              faceid = *(REF_INT *)((long)ref_node->global + (long)(edgeid * 6 + 5) * 4);
              uVar3 = ref_geom_node_min_angle((REF_GRID)filename_local,faceid,&short_edge_tol);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xb3f,"ref_geom_feedback",(ulong)uVar3,"node angle");
                return uVar3;
              }
              if (short_edge_tol <= angle) {
                fprintf(__stream,"# sliver deg=%.3f at geom node %d\n %f %f %f\n",short_edge_tol,
                        *(undefined8 *)(*(long *)(ref_mpi + 1) + (long)(faceid * 0xf) * 8),
                        *(undefined8 *)(*(long *)(ref_mpi + 1) + (long)(faceid * 0xf + 1) * 8),
                        *(undefined8 *)(*(long *)(ref_mpi + 1) + (long)(faceid * 0xf + 2) * 8),
                        (ulong)*(uint *)((long)ref_node->global + (long)(edgeid * 6 + 1) * 4));
                ref_private_status_reis_ai_1._4_4_ = ref_private_status_reis_ai_1._4_4_ + 1;
              }
            }
          }
          if ((long)nfilter != (long)ref_private_status_reis_ai_1._4_4_) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xb48,"ref_geom_feedback","tecplot sliver different recount",(long)nfilter,
                   (long)ref_private_status_reis_ai_1._4_4_);
            return 1;
          }
        }
        if (0 < (int)local_a0) {
          printf("exporting short edge locations to %s\n",ref_geom);
          fprintf(__stream,"zone t=\"short edge\", i=%d, datapacking=%s\n",(ulong)local_a0,"point");
          ref_private_status_reis_ai_1._4_4_ = 0;
          for (edgeid = 0; edgeid < ref_node->max; edgeid = edgeid + 1) {
            if (*(int *)((long)ref_node->global + (long)(edgeid * 6) * 4) == 0) {
              faceid = *(REF_INT *)((long)ref_node->global + (long)(edgeid * 6 + 5) * 4);
              uVar3 = ref_geom_node_short_edge
                                ((REF_GRID)filename_local,faceid,&diag,&curve,
                                 (REF_INT *)((long)&angle_tol + 4));
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xb54,"ref_geom_feedback",(ulong)uVar3,"short edge");
                return uVar3;
              }
              if (diag <= short_edge) {
                fprintf(__stream,"# short edge diagonal %.3e ratio %.3e edge id %d\n%f %f %f\n",
                        curve,diag,
                        *(undefined8 *)(*(long *)(ref_mpi + 1) + (long)(faceid * 0xf) * 8),
                        *(undefined8 *)(*(long *)(ref_mpi + 1) + (long)(faceid * 0xf + 1) * 8),
                        *(undefined8 *)(*(long *)(ref_mpi + 1) + (long)(faceid * 0xf + 2) * 8),
                        (ulong)angle_tol._4_4_);
                ref_private_status_reis_ai_1._4_4_ = ref_private_status_reis_ai_1._4_4_ + 1;
              }
            }
          }
          if ((long)(int)local_a0 != (long)ref_private_status_reis_ai_1._4_4_) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xb5e,"ref_geom_feedback","tecplot short edge different recount",
                   (long)(int)local_a0,(long)ref_private_status_reis_ai_1._4_4_);
            return 1;
          }
        }
        if (0 < (int)ref_private_status_reis_ai._4_4_) {
          printf("exporting filtered high curvature locations to %s\n",ref_geom);
          fprintf(__stream,"zone t=\"filtered\", i=%d, datapacking=%s\n",
                  (ulong)ref_private_status_reis_ai._4_4_,"point");
          ref_private_status_reis_ai_1._4_4_ = 0;
          for (angle_tol._0_4_ = 1;
              (int)angle_tol._0_4_ <= *(int *)((long)&ref_node->old_n_global + 4);
              angle_tol._0_4_ = angle_tol._0_4_ + 1) {
            uVar3 = ref_geom_face_curve_tol
                              ((REF_GRID)filename_local,angle_tol._0_4_,&local_78,(REF_DBL *)&nshort
                              );
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xb68,"ref_geom_feedback",(ulong)uVar3,"curved face");
              return uVar3;
            }
            if (local_78 < 1.0) {
              fprintf(__stream,"# curve/tol %.3e face id %d\n%f %f %f\n",local_78,_nshort,
                      location[0],location[1],(ulong)angle_tol._0_4_);
              ref_private_status_reis_ai_1._4_4_ = ref_private_status_reis_ai_1._4_4_ + 1;
            }
          }
          if ((long)(int)ref_private_status_reis_ai._4_4_ !=
              (long)ref_private_status_reis_ai_1._4_4_) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xb6f,"ref_geom_feedback","tecplot filtered curvature different recount",
                   (long)(int)ref_private_status_reis_ai._4_4_,
                   (long)ref_private_status_reis_ai_1._4_4_);
            return 1;
          }
        }
        fclose(__stream);
      }
      ref_grid_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xad5,
             "ref_geom_feedback","parallel implementation is incomplete",1,
             (ulong)ref_grid->partitioner);
      ref_grid_local._4_4_ = 1;
    }
  }
  else {
    if (ref_grid->mpi->id == 0) {
      printf("ref_geom_feedback does not support Effective EGADS\n");
    }
    ref_grid_local._4_4_ = 0;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_feedback(REF_GRID ref_grid, const char *filename) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INT geom, node, edgeid, faceid;
  REF_DBL angle_tol = 10.0;
  REF_DBL angle;
  REF_DBL short_edge_tol = 1e-3;
  REF_DBL short_edge, diag;
  REF_DBL curve;
  REF_DBL location[3];
  REF_INT nsliver, nshort, nfilter;

  if (ref_geom_effective(ref_geom)) {
    /* EFFECTIVE */
    if (ref_mpi_once(ref_grid_mpi(ref_grid)))
      printf("ref_geom_feedback does not support Effective EGADS\n");
    return REF_SUCCESS;
  }

  REIS(REF_MIGRATE_SINGLE, ref_grid_partitioner(ref_grid),
       "parallel implementation is incomplete");

  if (ref_mpi_once(ref_mpi))
    printf(
        "Triaging geometry for issues impacting efficiency and robustness\n");

  if (ref_mpi_once(ref_mpi)) {
    printf(
        "scanning for discrete face corners with slivers or cusps of %.1f deg "
        "or "
        "less\n",
        angle_tol);
    printf(
        "slivers in flat regions constrain the mesh and are efficiency "
        "concerns\n");
    printf(
        "cusps (very small angles) in curved regions may be fatal with loose "
        "tolerances\n");
    printf(
        "  because the edge/face topology becomes ambiguous with adaptive "
        "refinement\n");
  }
  nsliver = 0;
  each_ref_geom_node(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    RSS(ref_geom_node_min_angle(ref_grid, node, &angle), "node angle");
    if (angle <= angle_tol) {
      printf("%f %f %f # sliver deg=%.3f at geom node %d\n",
             ref_node_xyz(ref_node, 0, node), ref_node_xyz(ref_node, 1, node),
             ref_node_xyz(ref_node, 2, node), angle,
             ref_geom_id(ref_geom, geom));
      nsliver++;
    }
  }
  if (ref_mpi_once(ref_mpi))
    printf("%d geometry nodes with slivers or cusps of %.1f deg or less\n",
           nsliver, angle_tol);

  nshort = 0;
  if (ref_geom_model_loaded(ref_geom)) {
    if (ref_mpi_once(ref_mpi)) {
      printf(
          "scanning for geom nodes with shortest/longest edge ratios of %.3f "
          "or "
          "less\n",
          short_edge_tol);
      printf(
          "short edges are efficiency concerns that rarely create failures.\n");
    }
    each_ref_geom_node(ref_geom, geom) {
      node = ref_geom_node(ref_geom, geom);
      RSS(ref_geom_node_short_edge(ref_grid, node, &short_edge, &diag, &edgeid),
          "short edge");
      if (short_edge <= short_edge_tol) {
        printf("%f %f %f # short edge %.2e ratio %.2e id %d\n",
               ref_node_xyz(ref_node, 0, node), ref_node_xyz(ref_node, 1, node),
               ref_node_xyz(ref_node, 2, node), diag, short_edge, edgeid);
        nshort++;
      }
    }
    if (ref_mpi_once(ref_mpi))
      printf(
          "%d geometry nodes with shortest/longest edge ratios of %.3f or "
          "less\n",
          nshort, short_edge_tol);
  }

  nfilter = 0;
  if (ref_geom_model_loaded(ref_geom)) {
    if (ref_mpi_once(ref_mpi)) {
      printf(
          "scanning for surface curvature tighter than face-edge tolerance\n");
      printf("tight surface curvature is ignored where it reduces mesh\n");
      printf("  spacing below edge and face parameter curve tolerance\n");
      printf("these locations are likely to be accommodated unless\n");
      printf("  the error estimation resolves the high surface curvature\n");
    }
    for (faceid = 1; faceid <= ref_geom->nedge; faceid++) {
      RSS(ref_geom_face_curve_tol(ref_grid, faceid, &curve, location),
          "curved face");
      if (curve < 1.0) {
        printf("%f %f %f # curve/tol %.3e face id %d\n", location[0],
               location[1], location[2], curve, faceid);
        nfilter++;
      }
    }
    if (ref_mpi_once(ref_mpi))
      printf("%d locations with filtered curvature\n", nfilter);
  }

  if (ref_mpi_once(ref_mpi) && (nsliver > 0 || nshort > 0 || nfilter > 0)) {
    FILE *file;
    REF_INT n;
    file = fopen(filename, "w");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
    fprintf(file, "title=\"tecplot refine geometry triage\"\n");
    fprintf(file, "variables = \"x\" \"y\" \"z\"\n");

    if (nsliver > 0) {
      printf("exporting slivers locations to %s\n", filename);
      fprintf(file, "zone t=\"sliver\", i=%d, datapacking=%s\n", nsliver,
              "point");
      n = 0;
      each_ref_geom_node(ref_geom, geom) {
        node = ref_geom_node(ref_geom, geom);
        RSS(ref_geom_node_min_angle(ref_grid, node, &angle), "node angle");
        if (angle <= angle_tol) {
          fprintf(file, "# sliver deg=%.3f at geom node %d\n %f %f %f\n", angle,
                  ref_geom_id(ref_geom, geom), ref_node_xyz(ref_node, 0, node),
                  ref_node_xyz(ref_node, 1, node),
                  ref_node_xyz(ref_node, 2, node));
          n++;
        }
      }
      REIS(nsliver, n, "tecplot sliver different recount");
    }

    if (nshort > 0) {
      printf("exporting short edge locations to %s\n", filename);
      fprintf(file, "zone t=\"short edge\", i=%d, datapacking=%s\n", nshort,
              "point");
      n = 0;
      each_ref_geom_node(ref_geom, geom) {
        node = ref_geom_node(ref_geom, geom);
        RSS(ref_geom_node_short_edge(ref_grid, node, &short_edge, &diag,
                                     &edgeid),
            "short edge");
        if (short_edge <= short_edge_tol) {
          fprintf(
              file,
              "# short edge diagonal %.3e ratio %.3e edge id %d\n%f %f %f\n",
              diag, short_edge, edgeid, ref_node_xyz(ref_node, 0, node),
              ref_node_xyz(ref_node, 1, node), ref_node_xyz(ref_node, 2, node));
          n++;
        }
      }
      REIS(nshort, n, "tecplot short edge different recount");
    }

    if (nfilter > 0) {
      printf("exporting filtered high curvature locations to %s\n", filename);
      fprintf(file, "zone t=\"filtered\", i=%d, datapacking=%s\n", nfilter,
              "point");
      n = 0;
      for (faceid = 1; faceid <= ref_geom->nedge; faceid++) {
        RSS(ref_geom_face_curve_tol(ref_grid, faceid, &curve, location),
            "curved face");
        if (curve < 1.0) {
          fprintf(file, "# curve/tol %.3e face id %d\n%f %f %f\n", curve,
                  faceid, location[0], location[1], location[2]);
          n++;
        }
      }
      REIS(nfilter, n, "tecplot filtered curvature different recount");
    }

    fclose(file);
  }
  return REF_SUCCESS;
}